

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxVMFunctionCall::Resolve(FxVMFunctionCall *this,FCompileContext *ctx)

{
  PFunction *pPVar1;
  PPrototype *pPVar2;
  PType *pPVar3;
  PClass *pPVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxConstant *this_00;
  undefined4 extraout_var_01;
  FxTypeCast *this_01;
  FxExpression *pFVar9;
  PPointer *pPVar10;
  PVoidType **ppPVar11;
  FxExpression **ppFVar12;
  uint uVar13;
  char *pcVar14;
  char *message;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  TArray<FxExpression_*,_FxExpression_*> *pTVar19;
  bool bVar20;
  bool writable;
  PType *local_90;
  FScriptPosition *local_88;
  undefined1 local_79;
  ulong local_78;
  Variant *local_70;
  ulong local_68;
  TArray<FxExpression_*,_FxExpression_*> *local_60;
  ulong local_58;
  ulong local_50;
  FCompileContext *local_48;
  VMFunction *local_40;
  FxConstant *local_38;
  PClass *pPVar8;
  undefined4 extraout_var_02;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  pFVar9 = this->Self;
  if (pFVar9 != (FxExpression *)0x0) {
    iVar5 = (*pFVar9->_vptr_FxExpression[2])(pFVar9,ctx);
    this->Self = (FxExpression *)CONCAT44(extraout_var,iVar5);
    if ((FxExpression *)CONCAT44(extraout_var,iVar5) == (FxExpression *)0x0) goto LAB_00534a23;
  }
  pPVar1 = this->Function;
  local_70 = (pPVar1->Variants).Array;
  uVar13 = local_70->Flags;
  uVar18 = 3;
  if ((uVar13 & 4) == 0) {
    uVar18 = (ulong)(uVar13 >> 1 & 1);
  }
  pPVar2 = local_70->Proto;
  local_40 = local_70->Implementation;
  if ((pFVar9 == (FxExpression *)0x0) && ((uVar13 & 2) != 0)) {
    pcVar14 = "Call to non-static function without a self pointer";
LAB_00534559:
    FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,pcVar14);
  }
  else {
    uVar13 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count;
    if (uVar13 == 0) {
      if ((((pPVar2->ArgumentTypes).Count <= (uint)uVar18) ||
          ((pPVar2->ArgumentTypes).Array[uVar18] == (PType *)0x0)) ||
         (((local_70->ArgFlags).Array[uVar18] & 1) != 0)) {
LAB_00534a96:
        if ((pPVar2->ReturnTypes).Count == 0) {
          ppPVar11 = &TypeVoid;
        }
        else {
          ppPVar11 = (PVoidType **)(pPVar2->ReturnTypes).Array;
        }
        (this->super_FxExpression).ValueType = &(*ppPVar11)->super_PType;
        return &this->super_FxExpression;
      }
      pcVar14 = FName::NameData.NameArray
                [*(int *)&(pPVar1->super_PSymbol).super_PTypeBase.super_DObject.field_0x24].Text;
      message = "Insufficient arguments in call to %s";
    }
    else {
      uVar6 = (pPVar2->ArgumentTypes).Count;
      if (((pPVar2->ArgumentTypes).Array[uVar6 - 1] == (PType *)0x0) ||
         (uVar13 + (uint)uVar18 <= uVar6)) {
        pTVar19 = &(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>;
        uVar16 = 0;
        uVar17 = 0;
        local_68 = 0;
        local_90 = (PType *)0x0;
        uVar13 = 0;
        local_78 = uVar18;
        local_60 = pTVar19;
        local_58 = uVar18;
        do {
          local_88 = &(this->super_FxExpression).ScriptPosition;
          iVar5 = (int)uVar16;
          if ((local_68 & 1) == 0) {
            uVar6 = (int)uVar18 + iVar5;
            pPVar3 = (pPVar2->ArgumentTypes).Array[uVar6];
            if (pPVar3 == (PType *)0x0) {
              local_68 = CONCAT71((uint7)(uint3)(uVar6 >> 8),1);
              goto LAB_0053468c;
            }
            uVar13 = (local_70->ArgFlags).Array[uVar6];
            local_90 = pPVar3;
          }
          else {
LAB_0053468c:
            if (local_90 == (PType *)0x0) {
              __assert_fail("type != nullptr",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                            ,0x1e8c,
                            "virtual FxExpression *FxVMFunctionCall::Resolve(FCompileContext &)");
            }
          }
          ppFVar12 = ((TArray<FxExpression_*,_FxExpression_*> *)&pTVar19->Array)->Array;
          pFVar9 = ppFVar12[uVar16];
          uVar15 = uVar17;
          if (pFVar9->ExprType == EFX_NamedNode) {
            if ((uVar13 & 1) == 0) {
              pcVar14 = 
              "Cannot use a named argument here - not all required arguments have been passed.";
              goto LAB_00534559;
            }
            if ((local_68 & 1) != 0) {
              pcVar14 = "Cannot use a named argument in the varargs part of the parameter list.";
              goto LAB_00534559;
            }
            iVar7 = *(int *)&pFVar9[1]._vptr_FxExpression;
            uVar13 = (local_70->ArgNames).Count - (int)uVar18;
            if (uVar13 == 0) {
LAB_005349f8:
              pcVar14 = FName::NameData.NameArray[iVar7].Text;
              message = "Named argument %s not found.";
              goto LAB_00534a17;
            }
            uVar18 = 0;
            while ((local_70->ArgNames).Array[(uint)((int)local_78 + (int)uVar18)].Index != iVar7) {
              uVar18 = uVar18 + 1;
              if (uVar13 == uVar18) goto LAB_005349f8;
            }
            if ((uVar18 & 0xffffffff) < uVar16) {
              pcVar14 = FName::NameData.NameArray[iVar7].Text;
              message = "Named argument %s comes before current position in argument list.";
              goto LAB_00534a17;
            }
            ppFVar12[uVar16] = (FxExpression *)pFVar9[1].ScriptPosition.FileName.Chars;
            pFVar9[1].ScriptPosition.FileName.Chars = (char *)0x0;
            local_50 = uVar17;
            local_48 = ctx;
            (*pFVar9->_vptr_FxExpression[1])();
            if (0 < (int)(uVar18 - uVar16)) {
              uVar17 = 0;
              do {
                pPVar4 = PPointer::RegistrationInfo.MyClass;
                uVar13 = (int)uVar17 + iVar5;
                uVar15 = (ulong)((int)local_58 + uVar13);
                pPVar10 = (PPointer *)(pPVar2->ArgumentTypes).Array[uVar15];
                if ((*(byte *)((long)(local_70->ArgFlags).Array + uVar15 * 4 + 2) & 1) != 0) {
                  pPVar8 = (pPVar10->super_PBasicType).super_PType.super_PTypeBase.super_DObject.
                           Class;
                  if (pPVar8 == (PClass *)0x0) {
                    iVar7 = (**(pPVar10->super_PBasicType).super_PType.super_PTypeBase.super_DObject
                               ._vptr_DObject)(pPVar10);
                    pPVar8 = (PClass *)CONCAT44(extraout_var_00,iVar7);
                    (pPVar10->super_PBasicType).super_PType.super_PTypeBase.super_DObject.Class =
                         pPVar8;
                  }
                  bVar20 = pPVar8 != (PClass *)0x0;
                  if (pPVar8 != pPVar4 && bVar20) {
                    do {
                      pPVar8 = pPVar8->ParentClass;
                      bVar20 = pPVar8 != (PClass *)0x0;
                      if (pPVar8 == pPVar4) break;
                    } while (pPVar8 != (PClass *)0x0);
                  }
                  pPVar10 = TypeNullPtr;
                  if (!bVar20) {
                    __assert_fail("ntype->IsKindOf(RUNTIME_CLASS(PPointer))",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                                  ,0x1eb6,
                                  "virtual FxExpression *FxVMFunctionCall::Resolve(FCompileContext &)"
                                 );
                  }
                }
                this_00 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x38);
                FxConstant::FxConstant
                          (this_00,(PType *)pPVar10,(local_40->DefaultArgs).Array + uVar15,local_88)
                ;
                pTVar19 = local_60;
                local_38 = this_00;
                TArray<FxExpression_*,_FxExpression_*>::Insert
                          (local_60,uVar13,(FxExpression **)&local_38);
                uVar17 = uVar17 + 1;
              } while (uVar17 < (uVar18 - uVar16 & 0xffffffff));
            }
            uVar13 = (int)local_58 + iVar5;
            local_90 = (pPVar2->ArgumentTypes).Array[uVar13];
            uVar13 = (local_70->ArgFlags).Array[uVar13];
            uVar15 = local_50;
            ctx = local_48;
            uVar18 = local_58;
          }
          if ((uVar13 & 0x10800) == 0) {
            this_01 = (FxTypeCast *)FMemArena::Alloc(&FxAlloc,0x38);
            FxTypeCast::FxTypeCast
                      (this_01,((TArray<FxExpression_*,_FxExpression_*> *)&local_60->Array)->Array
                               [uVar16],local_90,false,false);
            pTVar19 = local_60;
            iVar5 = (*(this_01->super_FxExpression)._vptr_FxExpression[2])(this_01,ctx);
            pFVar9 = (FxExpression *)CONCAT44(extraout_var_02,iVar5);
          }
          else {
            pFVar9 = ((TArray<FxExpression_*,_FxExpression_*> *)&pTVar19->Array)->Array[uVar16];
            iVar5 = (*pFVar9->_vptr_FxExpression[2])(pFVar9,ctx);
            ((TArray<FxExpression_*,_FxExpression_*> *)&pTVar19->Array)->Array[uVar16] =
                 (FxExpression *)CONCAT44(extraout_var_01,iVar5);
            pFVar9 = ((TArray<FxExpression_*,_FxExpression_*> *)&pTVar19->Array)->Array[uVar16];
            if (pFVar9 == (FxExpression *)0x0) {
              pFVar9 = (FxExpression *)0x0;
            }
            else if ((PPointer *)pFVar9->ValueType != TypeNullPtr) {
              (*pFVar9->_vptr_FxExpression[4])(pFVar9,ctx,&local_79);
              ppFVar12 = ((TArray<FxExpression_*,_FxExpression_*> *)&pTVar19->Array)->Array;
              if ((uVar13 >> 0x10 & 1) != 0) {
                pPVar10 = NewPointer(ppFVar12[uVar16]->ValueType,false);
                ppFVar12 = ((TArray<FxExpression_*,_FxExpression_*> *)&pTVar19->Array)->Array;
                ppFVar12[uVar16]->ValueType = (PType *)pPVar10;
              }
              pFVar9 = ppFVar12[uVar16];
              if (local_90 != pFVar9->ValueType) {
                FScriptPosition::Message
                          (local_88,2,"Type mismatch in reference argument %s",
                           FName::NameData.NameArray
                           [*(int *)&(this->Function->super_PSymbol).super_PTypeBase.super_DObject.
                                     field_0x24].Text);
                pFVar9 = (FxExpression *)0x0;
              }
            }
          }
          uVar17 = CONCAT71((int7)(uVar15 >> 8),(byte)uVar15 | pFVar9 == (FxExpression *)0x0);
          (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar16] = pFVar9;
          uVar16 = uVar16 + 1;
          uVar6 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count;
        } while (uVar16 < uVar6);
        uVar6 = uVar6 + (int)uVar18;
        if ((((pPVar2->ArgumentTypes).Count <= uVar6) ||
            ((pPVar2->ArgumentTypes).Array[(int)uVar6] == (PType *)0x0)) ||
           (((((this->Function->Variants).Array)->ArgFlags).Array[(int)uVar6] & 1) != 0)) {
          if ((uVar15 & 1) == 0 && pFVar9 != (FxExpression *)0x0) goto LAB_00534a96;
          goto LAB_00534a23;
        }
        pcVar14 = FName::NameData.NameArray
                  [*(int *)&(this->Function->super_PSymbol).super_PTypeBase.super_DObject.field_0x24
                  ].Text;
        message = "Insufficient arguments in call to %s";
      }
      else {
        pcVar14 = FName::NameData.NameArray
                  [*(int *)&(pPVar1->super_PSymbol).super_PTypeBase.super_DObject.field_0x24].Text;
        message = "Too many arguments in call to %s";
      }
    }
LAB_00534a17:
    FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,message,pcVar14);
  }
LAB_00534a23:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxVMFunctionCall::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE_OPT(Self, ctx);
	bool failed = false;
	auto proto = Function->Variants[0].Proto;
	auto &argtypes = proto->ArgumentTypes;
	auto &argnames = Function->Variants[0].ArgNames;
	auto &argflags = Function->Variants[0].ArgFlags;
	auto &defaults = Function->Variants[0].Implementation->DefaultArgs;

	int implicit = Function->GetImplicitArgs();

	// This should never happen.
	if (Self == nullptr && (Function->Variants[0].Flags & VARF_Method))
	{
		ScriptPosition.Message(MSG_ERROR, "Call to non-static function without a self pointer");
		delete this;
		return nullptr;
	}

	if (ArgList.Size() > 0)
	{
		bool foundvarargs = false;
		PType * type = nullptr;
		int flag = 0;
		if (argtypes.Last() != nullptr && ArgList.Size() + implicit > argtypes.Size())
		{
			ScriptPosition.Message(MSG_ERROR, "Too many arguments in call to %s", Function->SymbolName.GetChars());
			delete this;
			return nullptr;
		}

		for (unsigned i = 0; i < ArgList.Size(); i++)
		{
			// Varargs must all have the same type as the last typed argument. A_Jump is the only function using it.
			if (!foundvarargs)
			{
				if (argtypes[i + implicit] == nullptr) foundvarargs = true;
				else
				{
					type = argtypes[i + implicit];
					flag = argflags[i + implicit];
				}
			}
			assert(type != nullptr);

			if (ArgList[i]->ExprType == EFX_NamedNode)
			{
				if (!(flag & VARF_Optional))
				{
					ScriptPosition.Message(MSG_ERROR, "Cannot use a named argument here - not all required arguments have been passed.");
					delete this;
					return nullptr;
				}
				if (foundvarargs)
				{
					ScriptPosition.Message(MSG_ERROR, "Cannot use a named argument in the varargs part of the parameter list.");
					delete this;
					return nullptr;
				}
				unsigned j;
				bool done = false;
				FName name = static_cast<FxNamedNode *>(ArgList[i])->name;
				for (j = 0; j < argnames.Size() - implicit; j++)
				{
					if (argnames[j + implicit] == name)
					{
						if (j < i)
						{
							ScriptPosition.Message(MSG_ERROR, "Named argument %s comes before current position in argument list.", name.GetChars());
							delete this;
							return nullptr;
						}
						// copy the original argument into the list
						auto old = static_cast<FxNamedNode *>(ArgList[i]);
						ArgList[i] = old->value; 
						old->value = nullptr;
						delete old;
						// now fill the gap with constants created from the default list so that we got a full list of arguments.
						int insert = j - i;
						for (int k = 0; k < insert; k++)
						{
							auto ntype = argtypes[i + k + implicit];
							// If this is a reference argument, the pointer type must be undone because the code below expects the pointed type as value type.
							if (argflags[i + k + implicit] & VARF_Ref)
							{
								assert(ntype->IsKindOf(RUNTIME_CLASS(PPointer)));
								ntype = TypeNullPtr; // the default of a reference type can only be a null pointer
							}
							auto x = new FxConstant(ntype, defaults[i + k + implicit], ScriptPosition);
							ArgList.Insert(i + k, x);
						}
						done = true;
						break;
					}
				}
				if (!done)
				{
					ScriptPosition.Message(MSG_ERROR, "Named argument %s not found.", name.GetChars());
					delete this;
					return nullptr;
				}
				// re-get the proper info for the inserted node.
				type = argtypes[i + implicit];
				flag = argflags[i + implicit];
			}

			FxExpression *x;
			if (!(flag & (VARF_Ref|VARF_Out)))
			{
				x = new FxTypeCast(ArgList[i], type, false);
				x = x->Resolve(ctx);
			}
			else
			{
				bool writable;
				ArgList[i] = ArgList[i]->Resolve(ctx);	// nust be resolved before the address is requested.
				if (ArgList[i] != nullptr && ArgList[i]->ValueType != TypeNullPtr)
				{
					ArgList[i]->RequestAddress(ctx, &writable);
					if (flag & VARF_Ref) ArgList[i]->ValueType = NewPointer(ArgList[i]->ValueType);
					// For a reference argument the types must match 100%.
					if (type != ArgList[i]->ValueType)
					{
						ScriptPosition.Message(MSG_ERROR, "Type mismatch in reference argument %s", Function->SymbolName.GetChars());
						x = nullptr;
					}
					else
					{
						x = ArgList[i];
					}
				}
				else x = ArgList[i];
			}
			failed |= (x == nullptr);
			ArgList[i] = x;
		}
		int numargs = ArgList.Size() + implicit;
		if ((unsigned)numargs < argtypes.Size() && argtypes[numargs] != nullptr)
		{
			auto flags = Function->Variants[0].ArgFlags[numargs];
			if (!(flags & VARF_Optional))
			{
				ScriptPosition.Message(MSG_ERROR, "Insufficient arguments in call to %s", Function->SymbolName.GetChars());
				delete this;
				return nullptr;
			}
		}
	}
	else
	{
		if ((unsigned)implicit < argtypes.Size() && argtypes[implicit] != nullptr)
		{
			auto flags = Function->Variants[0].ArgFlags[implicit];
			if (!(flags & VARF_Optional))
			{
				ScriptPosition.Message(MSG_ERROR, "Insufficient arguments in call to %s", Function->SymbolName.GetChars());
				delete this;
				return nullptr;
			}
		}
	}
	if (failed)
	{
		delete this;
		return nullptr;
	}
	TArray<PType *> &rets = proto->ReturnTypes;
	if (rets.Size() > 0)
	{
		ValueType = rets[0];
	}
	else
	{
		ValueType = TypeVoid;
	}
	return this;
}